

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::WriteData_EveryoneWrites
          (BP5Writer *this,BufferV *Data,bool SerializedWriters)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Comm *this_00;
  uint64_t *buf;
  allocator local_a1;
  string local_a0;
  uint64_t *local_80;
  uint64_t nextWriterPos_1;
  Comm local_60;
  Comm local_58;
  Comm local_50;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  
  lVar3 = __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                         &aggregator::MPIChain::typeinfo,0);
  this_00 = (Comm *)(lVar3 + 0x20);
  iVar1 = helper::Comm::Rank(this_00);
  if (0 < iVar1) {
    iVar1 = helper::Comm::Rank(this_00);
    std::__cxx11::string::string
              ((string *)&local_a0,"Chain token in BP5Writer::WriteData",
               (allocator *)&nextWriterPos_1);
    helper::Comm::Recv<unsigned_long>
              ((Status *)&DataVec,this_00,&this->m_DataPos,1,iVar1 + -1,0,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  buf = &this->m_DataPos;
  uVar4 = helper::PaddingToAlignOffset
                    (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  uVar4 = uVar4 + this->m_DataPos;
  this->m_DataPos = uVar4;
  this->m_StartDataPos = uVar4;
  if (!SerializedWriters) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 < iVar2 + -1) {
      uVar4 = *buf;
      local_80 = buf;
      uVar5 = adios2::format::BufferV::Size(Data);
      DataVec.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(uVar5 + uVar4);
      iVar1 = helper::Comm::Rank(this_00);
      std::__cxx11::string::string
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData",
                 (allocator *)&nextWriterPos_1);
      helper::Comm::Isend<unsigned_long>
                (&local_50,(unsigned_long *)this_00,(size_t)&DataVec,1,iVar1 + 1,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_50);
      std::__cxx11::string::~string((string *)&local_a0);
      buf = local_80;
    }
  }
  uVar4 = adios2::format::BufferV::Size(Data);
  this->m_DataPos = this->m_DataPos + uVar4;
  (*Data->_vptr_BufferV[2])(&DataVec,Data);
  transportman::TransportMan::WriteFileAt
            (&this->m_FileDataManager,
             DataVec.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (long)DataVec.
                   super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)DataVec.
                   super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4,this->m_StartDataPos,-1);
  if (SerializedWriters) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 < iVar2 + -1) {
      nextWriterPos_1 = *buf;
      iVar1 = helper::Comm::Rank(this_00);
      std::__cxx11::string::string
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData",&local_a1);
      helper::Comm::Isend<unsigned_long>
                (&local_58,(unsigned_long *)this_00,(size_t)&nextWriterPos_1,1,iVar1 + 1,
                 (string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_58);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  iVar1 = helper::Comm::Size(this_00);
  if (1 < iVar1) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 == iVar2 + -1) {
      std::__cxx11::string::string
                ((string *)&local_a0,"Final chain token in BP5Writer::WriteData",
                 (allocator *)&nextWriterPos_1);
      helper::Comm::Isend<unsigned_long>
                (&local_60,(unsigned_long *)this_00,(size_t)buf,1,0,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    iVar1 = helper::Comm::Rank(this_00);
    if (iVar1 == 0) {
      iVar1 = helper::Comm::Size(this_00);
      std::__cxx11::string::string
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData",&local_a1);
      helper::Comm::Recv<unsigned_long>
                ((Status *)&nextWriterPos_1,this_00,buf,1,iVar1 + -1,0,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
            (&DataVec.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)
  ;
  return;
}

Assistant:

void BP5Writer::WriteData_EveryoneWrites(format::BufferV *Data, bool SerializedWriters)
{
    const aggregator::MPIChain *a = dynamic_cast<aggregator::MPIChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on aggregator
    // others will wait for the position to arrive from the rank below

    if (a->m_Comm.Rank() > 0)
    {
        a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Rank() - 1, 0,
                       "Chain token in BP5Writer::WriteData");
    }

    // align to PAGE_SIZE
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
    m_StartDataPos = m_DataPos;

    if (!SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* Send the token before writing so everyone can start writing asap */
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    m_DataPos += Data->Size();
    std::vector<core::iovec> DataVec = Data->DataVec();
    m_FileDataManager.WriteFileAt(DataVec.data(), DataVec.size(), m_StartDataPos);

    if (SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* send token now, effectively serializing the writers in the chain */
        uint64_t nextWriterPos = m_DataPos;
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    if (a->m_Comm.Size() > 1)
    {
        // at the end, last rank sends back the final data pos to first rank
        // so it can update its data pos
        if (a->m_Comm.Rank() == a->m_Comm.Size() - 1)
        {
            a->m_Comm.Isend(&m_DataPos, 1, 0, 0, "Final chain token in BP5Writer::WriteData");
        }
        if (a->m_Comm.Rank() == 0)
        {
            a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Size() - 1, 0,
                           "Chain token in BP5Writer::WriteData");
        }
    }
}